

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_PrintPreallocated(cJSON *item,char *buf,int len,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  printbuffer local_40;
  
  local_40.depth = 0;
  cVar1 = 0;
  if (buf != (char *)0x0 && -1 < len) {
    local_40.length = (size_t)(uint)len;
    local_40.offset = 0;
    local_40.noalloc = 1;
    local_40.hooks.allocate = global_hooks.allocate;
    local_40.hooks.deallocate = global_hooks.deallocate;
    local_40.hooks.reallocate = global_hooks.reallocate;
    local_40.buffer = (uchar *)buf;
    local_40.format = fmt;
    cVar1 = print_value(item,&local_40);
  }
  return cVar1;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_PrintPreallocated(cJSON *item, char *buf, const int len, const cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if ((len < 0) || (buf == NULL))
    {
        return false;
    }

    p.buffer = (unsigned char*)buf;
    p.length = (size_t)len;
    p.offset = 0;
    p.noalloc = true;
    p.format = fmt;
    p.hooks = global_hooks;

    return print_value(item, &p);
}